

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O3

void main_cold_7(void)

{
  fwrite("Output on stdout before sleep.\n",0x1f,1,_stdout);
  fwrite("Output on stderr before sleep.\n",0x1f,1,_stderr);
  fflush(_stdout);
  fflush(_stderr);
  sleep(1);
  fwrite("Output on stdout after sleep.\n",0x1e,1,_stdout);
  fwrite("Output on stderr after sleep.\n",0x1e,1,_stderr);
  fflush(_stdout);
  fflush(_stderr);
  return;
}

Assistant:

static int test7(int argc, const char* argv[])
{
  (void)argc;
  (void)argv;
  fprintf(stdout, "Output on stdout before sleep.\n");
  fprintf(stderr, "Output on stderr before sleep.\n");
  fflush(stdout);
  fflush(stderr);
  /* Sleep for 1 second.  */
  testProcess_sleep(1);
  fprintf(stdout, "Output on stdout after sleep.\n");
  fprintf(stderr, "Output on stderr after sleep.\n");
  fflush(stdout);
  fflush(stderr);
  return 0;
}